

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_shuffle_192_30(mzd_local_t *x,word mask)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (mask == 0) {
    uVar1 = 0;
  }
  else {
    uVar2 = 1;
    uVar1 = 0;
    wVar4 = mask;
    do {
      uVar5 = -wVar4 & wVar4 & x->w64[2];
      if (uVar5 != 0) {
        uVar5 = uVar2;
      }
      uVar1 = uVar1 | uVar5;
      uVar2 = uVar2 * 2;
      wVar4 = wVar4 - 1 & wVar4;
    } while (wVar4 != 0);
    uVar1 = uVar1 << 0x22;
  }
  if (mask == 0xffffffffffffffff) {
    uVar2 = 0;
  }
  else {
    uVar3 = ~mask;
    uVar5 = 1;
    uVar2 = 0;
    do {
      uVar6 = -uVar3 & uVar3 & x->w64[2];
      if (uVar6 != 0) {
        uVar6 = uVar5;
      }
      uVar2 = uVar2 | uVar6;
      uVar5 = uVar5 * 2;
      uVar3 = uVar3 - 1 & uVar3;
    } while (uVar3 != 0);
  }
  x->w64[2] = uVar2 | uVar1;
  return;
}

Assistant:

static inline void mzd_shuffle_30_idx(mzd_local_t* x, const word mask, unsigned int idx) {
  const word w          = CONST_BLOCK(x, 0)->w64[idx];
  const word a          = extract_bits(w, mask) << 34;
  BLOCK(x, 0)->w64[idx] = a | extract_bits(w, ~mask);
}